

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuReduce.c
# Opt level: O0

int Fxu_PreprocessCubePairs(Fxu_Matrix *p,Vec_Ptr_t *vCovers,int nPairsTotal,int nPairsMax)

{
  char *pSop;
  Fxu_Var *pFVar1;
  int iVar2;
  int iVar3;
  void *__s;
  int *__s_00;
  int nFanins;
  char *pSopCover;
  int local_80;
  int c;
  int k;
  int iQuant;
  int iPair;
  int CutOffQuant;
  int CutOffNum;
  int nSum;
  int nBitsMax;
  int nCubes;
  Fxu_Var *pVar;
  Fxu_Cube *pCube2;
  Fxu_Cube *pCube1;
  Fxu_Cube *pCubeLast;
  Fxu_Cube *pCubeFirst;
  int *pnPairCounters;
  uchar *pnLitsDiff;
  int nPairsMax_local;
  int nPairsTotal_local;
  Vec_Ptr_t *vCovers_local;
  Fxu_Matrix *p_local;
  
  iPair = -1;
  iQuant = -1;
  if (nPairsTotal <= nPairsMax) {
    __assert_fail("nPairsMax < nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x43,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  __s = malloc((long)nPairsTotal);
  memset(__s,0xff,(long)nPairsTotal);
  k = 0;
  CutOffNum = -1;
  for (pSopCover._4_4_ = 0; pSopCover._4_4_ < vCovers->nSize; pSopCover._4_4_ = pSopCover._4_4_ + 1)
  {
    pSop = (char *)vCovers->pArray[pSopCover._4_4_];
    if (pSop != (char *)0x0) {
      iVar2 = Abc_SopGetVarNum(pSop);
      Fxu_CountPairDiffs(pSop,(uchar *)((long)__s + (long)k));
      iVar3 = Abc_SopGetCubeNum(pSop);
      k = (iVar3 * (iVar3 + -1)) / 2 + k;
      if (CutOffNum < iVar2) {
        CutOffNum = iVar2;
      }
    }
  }
  if (k != nPairsTotal) {
    __assert_fail("iPair == nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x56,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  __s_00 = (int *)malloc((long)(CutOffNum << 1) << 2);
  memset(__s_00,0xff,(long)(CutOffNum << 1) << 2);
  memset(__s_00,0,(long)CutOffNum << 3);
  for (local_80 = 0; local_80 < nPairsTotal; local_80 = local_80 + 1) {
    __s_00[*(byte *)((long)__s + (long)local_80)] =
         __s_00[*(byte *)((long)__s + (long)local_80)] + 1;
  }
  if (*__s_00 == 0) {
    if (__s_00[1] == 0) {
      if (*__s_00 != 0) {
        __assert_fail("pnPairCounters[0] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0x6e,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (__s_00[1] != 0) {
        __assert_fail("pnPairCounters[1] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0x6f,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      CutOffQuant = 0;
      for (local_80 = 0; SBORROW4(local_80,CutOffNum * 2) != local_80 + CutOffNum * -2 < 0;
          local_80 = local_80 + 1) {
        CutOffQuant = __s_00[local_80] + CutOffQuant;
        if (nPairsMax <= CutOffQuant) {
          iPair = local_80;
          iQuant = __s_00[local_80] - (CutOffQuant - nPairsMax);
          break;
        }
      }
      if (__s_00 != (int *)0x0) {
        free(__s_00);
      }
      c = 0;
      k = 0;
      for (local_80 = 0; local_80 < nPairsTotal; local_80 = local_80 + 1) {
        if (iPair < (int)(uint)*(byte *)((long)__s + (long)local_80)) {
          *(undefined1 *)((long)__s + (long)local_80) = 0;
        }
        else if ((uint)*(byte *)((long)__s + (long)local_80) == iPair) {
          if (c < iQuant) {
            k = k + 1;
            c = c + 1;
          }
          else {
            *(undefined1 *)((long)__s + (long)local_80) = 0;
            c = c + 1;
          }
        }
        else {
          k = k + 1;
        }
      }
      if (k != nPairsMax) {
        __assert_fail("iPair == nPairsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0x8c,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      k = 0;
      for (pSopCover._4_4_ = 0; pSopCover._4_4_ < vCovers->nSize;
          pSopCover._4_4_ = pSopCover._4_4_ + 1) {
        if (vCovers->pArray[pSopCover._4_4_] != (void *)0x0) {
          pFVar1 = p->ppVars[pSopCover._4_4_ * 2 + 1];
          pCube2 = pFVar1->pFirst;
          pCube1 = pCube2;
          for (local_80 = 0; local_80 < pFVar1->nCubes; local_80 = local_80 + 1) {
            pCube1 = pCube1->pNext;
          }
          if ((pCube1 != (Fxu_Cube *)0x0) && (pCube1->pVar == pFVar1)) {
            __assert_fail("pCubeLast == NULL || pCubeLast->pVar != pVar",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                          ,0x9b,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
          }
          for (; pCube2 != pCube1; pCube2 = pCube2->pNext) {
            for (pVar = (Fxu_Var *)pCube2->pNext; pVar != (Fxu_Var *)pCube1; pVar = pVar->pNext) {
              if (*(char *)((long)__s + (long)k) != '\0') {
                Fxu_MatrixAddDivisor(p,pCube2,(Fxu_Cube *)pVar);
              }
              k = k + 1;
            }
          }
        }
      }
      if (k != nPairsTotal) {
        __assert_fail("iPair == nPairsTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0xa5,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      p_local._4_4_ = 1;
    }
    else {
      if (__s != (void *)0x0) {
        free(__s);
      }
      if (__s_00 != (int *)0x0) {
        free(__s_00);
      }
      printf("The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".\n");
      p_local._4_4_ = 0;
    }
  }
  else {
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (__s_00 != (int *)0x0) {
      free(__s_00);
    }
    printf("The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".\n");
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fxu_PreprocessCubePairs( Fxu_Matrix * p, Vec_Ptr_t * vCovers, int nPairsTotal, int nPairsMax )
{
    unsigned char * pnLitsDiff;   // storage for the counters of diff literals
    int * pnPairCounters;         // the counters of pairs for each number of diff literals
    Fxu_Cube * pCubeFirst, * pCubeLast;
    Fxu_Cube * pCube1, * pCube2;
    Fxu_Var * pVar;
    int nCubes, nBitsMax, nSum;
    int CutOffNum = -1, CutOffQuant = -1; // Suppress "might be used uninitialized"
    int iPair, iQuant, k, c;
//    abctime clk = Abc_Clock();
    char * pSopCover;
    int nFanins;

    assert( nPairsMax < nPairsTotal );

    // allocate storage for counter of diffs
    pnLitsDiff = ABC_FALLOC( unsigned char, nPairsTotal );
    // go through the covers and precompute the distances between the pairs
    iPair    =  0;
    nBitsMax = -1;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            nFanins = Abc_SopGetVarNum(pSopCover);
            // precompute the differences
            Fxu_CountPairDiffs( pSopCover, pnLitsDiff + iPair );
            // update the counter
            nCubes = Abc_SopGetCubeNum( pSopCover );
            iPair += nCubes * (nCubes - 1) / 2;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    assert( iPair == nPairsTotal );

    // allocate storage for counters of cube pairs by difference
    pnPairCounters = ABC_FALLOC( int, 2 * nBitsMax );
    memset( pnPairCounters, 0, sizeof(int) * 2 * nBitsMax );
    // count the number of different pairs
    for ( k = 0; k < nPairsTotal; k++ )
        pnPairCounters[ pnLitsDiff[k] ]++;
    // determine what pairs to take starting from the lower
    // so that there would be exactly pPairsMax pairs
    if ( pnPairCounters[0] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    if ( pnPairCounters[1] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    assert( pnPairCounters[0] == 0 ); // otherwise, covers are not dup-free
    assert( pnPairCounters[1] == 0 ); // otherwise, covers are not SCC-free
    nSum = 0;
    for ( k = 0; k < 2 * nBitsMax; k++ )
    {
        nSum += pnPairCounters[k];
        if ( nSum >= nPairsMax )
        {
            CutOffNum   = k;
            CutOffQuant = pnPairCounters[k] - (nSum - nPairsMax);
            break;
        }
    }
    ABC_FREE( pnPairCounters );

    // set to 0 all the pairs above the cut-off number and quantity
    iQuant = 0;
    iPair  = 0;
    for ( k = 0; k < nPairsTotal; k++ )
        if ( pnLitsDiff[k] > CutOffNum ) 
            pnLitsDiff[k] = 0;
        else if ( pnLitsDiff[k] == CutOffNum )
        {
            if ( iQuant++ >= CutOffQuant )
                pnLitsDiff[k] = 0;
            else
                iPair++;
        }
        else
            iPair++;
    assert( iPair == nPairsMax );

    // collect the corresponding pairs and add the divisors
    iPair = 0;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            // get the var
            pVar = p->ppVars[2*c+1];
            // get the first cube
            pCubeFirst = pVar->pFirst;
            // get the last cube
            pCubeLast = pCubeFirst;
            for ( k = 0; k < pVar->nCubes; k++ )
                pCubeLast = pCubeLast->pNext;
            assert( pCubeLast == NULL || pCubeLast->pVar != pVar );

            // go through the cube pairs
		    for ( pCube1 = pCubeFirst; pCube1 != pCubeLast; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1->pNext; pCube2 != pCubeLast; pCube2 = pCube2->pNext )
                    if ( pnLitsDiff[iPair++] )
                    {   // create the divisors for this pair
	                    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
                    }
        }
    assert( iPair == nPairsTotal );
    ABC_FREE( pnLitsDiff );
//ABC_PRT( "Preprocess", Abc_Clock() - clk );
    return 1;
}